

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextmarkdownimporter.cpp
# Opt level: O2

void __thiscall QTextMarkdownImporter::insertBlock(QTextMarkdownImporter *this)

{
  QStack<QPointer<QTextList>_> *this_00;
  Data *pDVar1;
  long lVar2;
  bool bVar3;
  iterator iVar4;
  iterator iVar5;
  QTextDocument *this_01;
  QTextList *p;
  QChar QVar6;
  QObject *pQVar7;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_90;
  undefined1 local_78 [16];
  undefined1 local_68 [24];
  anon_union_24_3_e3d07ef4_for_data local_50;
  char *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QTextCharFormat::QTextCharFormat((QTextCharFormat *)local_68);
  if ((this->m_spanFormatStack).super_QList<QTextCharFormat>.d.size != 0) {
    iVar4 = QList<QTextCharFormat>::end(&(this->m_spanFormatStack).super_QList<QTextCharFormat>);
    QTextFormat::operator=((QTextFormat *)local_68,&iVar4.i[-1].super_QTextFormat);
  }
  local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QTextBlockFormat::QTextBlockFormat((QTextBlockFormat *)local_78);
  this_00 = &this->m_listStack;
  if ((((this->m_listStack).super_QList<QPointer<QTextList>_>.d.size != 0) &&
      (this->m_needsInsertList == false)) && (this->m_listItem == true)) {
    iVar5 = QList<QPointer<QTextList>_>::end(&this_00->super_QList<QPointer<QTextList>_>);
    pDVar1 = iVar5.i[-1].wp.d;
    if (((pDVar1 == (Data *)0x0) ||
        ((pDVar1->strongref)._q_value.super___atomic_base<int>._M_i == 0)) ||
       (pQVar7 = iVar5.i[-1].wp.value, pQVar7 == (QObject *)0x0)) {
      local_50._0_4_ = 2;
      local_50._20_4_ = 0;
      local_50._4_8_ = 0;
      local_50._12_8_ = 0;
      local_38 = "default";
      QMessageLogger::warning();
      QDebug::operator<<((QDebug *)&local_90,"attempted to insert into a list that no longer exists"
                        );
      QDebug::~QDebug((QDebug *)&local_90);
    }
    else {
      QTextList::count((QTextList *)pQVar7);
      QTextList::item((QTextList *)&local_90,(int)pQVar7);
      QTextBlock::blockFormat((QTextBlock *)&local_50);
      QTextFormat::operator=((QTextFormat *)local_78,(QTextFormat *)&local_50);
      QTextFormat::~QTextFormat((QTextFormat *)&local_50);
    }
  }
  if (this->m_blockQuoteDepth != 0) {
    ::QVariant::QVariant((QVariant *)&local_50,this->m_blockQuoteDepth);
    QTextFormat::setProperty((QTextFormat *)local_78,0x1080,(QVariant *)&local_50);
    ::QVariant::~QVariant((QVariant *)&local_50);
    QTextBlockFormat::setLeftMargin
              ((QTextBlockFormat *)local_78,(double)(this->m_blockQuoteDepth * 0x28));
    QTextBlockFormat::setRightMargin((QTextBlockFormat *)local_78,40.0);
  }
  if (this->m_codeBlock == true) {
    ::QVariant::QVariant((QVariant *)&local_50,(QString *)&this->m_blockCodeLanguage);
    QTextFormat::setProperty((QTextFormat *)local_78,0x1090,(QVariant *)&local_50);
    ::QVariant::~QVariant((QVariant *)&local_50);
    if (this->m_blockCodeFence != '\0') {
      QTextBlockFormat::setNonBreakableLines((QTextBlockFormat *)local_78,true);
      QVar6.ucs._1_1_ = 0;
      QVar6.ucs._0_1_ = this->m_blockCodeFence;
      QString::QString((QString *)&local_90,QVar6);
      ::QVariant::QVariant((QVariant *)&local_50,(QString *)&local_90);
      QTextFormat::setProperty((QTextFormat *)local_78,0x1091,(QVariant *)&local_50);
      ::QVariant::~QVariant((QVariant *)&local_50);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_90);
    }
    QTextCharFormat::setFont((QTextCharFormat *)local_68,&this->m_monoFont,FontPropertiesAll);
  }
  else {
    QTextBlockFormat::setTopMargin((QTextBlockFormat *)local_78,(double)this->m_paragraphMargin);
    QTextBlockFormat::setBottomMargin((QTextBlockFormat *)local_78,(double)this->m_paragraphMargin);
  }
  if (this->m_markerType == NoMarker) {
    QTextFormat::clearProperty((QTextFormat *)local_78,0x10a0);
  }
  else {
    QTextBlockFormat::setMarker((QTextBlockFormat *)local_78,this->m_markerType);
  }
  lVar2 = (this->m_listStack).super_QList<QPointer<QTextList>_>.d.size;
  if (lVar2 != 0) {
    QTextBlockFormat::setIndent((QTextBlockFormat *)local_78,(int)lVar2);
  }
  this_01 = QTextCursor::document(&this->m_cursor);
  bVar3 = QTextDocument::isEmpty(this_01);
  if (bVar3) {
    QTextCursor::setBlockFormat(&this->m_cursor,(QTextBlockFormat *)local_78);
  }
  else {
    if (this->m_listItem != true) {
      QTextCursor::insertBlock
                (&this->m_cursor,(QTextBlockFormat *)local_78,(QTextCharFormat *)local_68);
      goto LAB_0052d739;
    }
    QTextCharFormat::QTextCharFormat((QTextCharFormat *)&local_50);
    QTextCursor::insertBlock
              (&this->m_cursor,(QTextBlockFormat *)local_78,(QTextCharFormat *)&local_50);
    QTextFormat::~QTextFormat((QTextFormat *)&local_50);
  }
  QTextCursor::setCharFormat(&this->m_cursor,(QTextCharFormat *)local_68);
LAB_0052d739:
  if (this->m_needsInsertList == true) {
    p = QTextCursor::createList(&this->m_cursor,&this->m_listFormat);
    QPointer<QTextList>::QPointer<void>((QPointer<QTextList> *)&local_50,p);
    QList<QPointer<QTextList>>::emplaceBack<QPointer<QTextList>const&>
              ((QList<QPointer<QTextList>> *)this_00,(QPointer<QTextList> *)&local_50);
    QWeakPointer<QObject>::~QWeakPointer((QWeakPointer<QObject> *)&local_50);
  }
  else if (((this->m_listStack).super_QList<QPointer<QTextList>_>.d.size != 0) &&
          (this->m_listItem == true)) {
    iVar5 = QList<QPointer<QTextList>_>::end(&this_00->super_QList<QPointer<QTextList>_>);
    bVar3 = QPointer::operator_cast_to_bool((QPointer *)(iVar5.i + -1));
    if (bVar3) {
      iVar5 = QList<QPointer<QTextList>_>::end(&this_00->super_QList<QPointer<QTextList>_>);
      pDVar1 = iVar5.i[-1].wp.d;
      if ((pDVar1 == (Data *)0x0) ||
         ((pDVar1->strongref)._q_value.super___atomic_base<int>._M_i == 0)) {
        pQVar7 = (QObject *)0x0;
      }
      else {
        pQVar7 = iVar5.i[-1].wp.value;
      }
      QTextCursor::block((QTextCursor *)&local_50.shared);
      QTextList::add((QTextList *)pQVar7,(QTextBlock *)&local_50);
    }
  }
  this->m_needsInsertBlock = false;
  this->m_needsInsertList = false;
  QTextFormat::~QTextFormat((QTextFormat *)local_78);
  QTextFormat::~QTextFormat((QTextFormat *)local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextMarkdownImporter::insertBlock()
{
    QTextCharFormat charFormat;
    if (!m_spanFormatStack.isEmpty())
        charFormat = m_spanFormatStack.top();
    QTextBlockFormat blockFormat;
    if (!m_listStack.isEmpty() && !m_needsInsertList && m_listItem) {
        QTextList *list = m_listStack.top();
        if (list)
            blockFormat = list->item(list->count() - 1).blockFormat();
        else
            qWarning() << "attempted to insert into a list that no longer exists";
    }
    if (m_blockQuoteDepth) {
        blockFormat.setProperty(QTextFormat::BlockQuoteLevel, m_blockQuoteDepth);
        blockFormat.setLeftMargin(qtmi_BlockQuoteIndent * m_blockQuoteDepth);
        blockFormat.setRightMargin(qtmi_BlockQuoteIndent);
    }
    if (m_codeBlock) {
        blockFormat.setProperty(QTextFormat::BlockCodeLanguage, m_blockCodeLanguage);
        if (m_blockCodeFence) {
            blockFormat.setNonBreakableLines(true);
            blockFormat.setProperty(QTextFormat::BlockCodeFence, QString(QLatin1Char(m_blockCodeFence)));
        }
        charFormat.setFont(m_monoFont);
    } else {
        blockFormat.setTopMargin(m_paragraphMargin);
        blockFormat.setBottomMargin(m_paragraphMargin);
    }
    if (m_markerType == QTextBlockFormat::MarkerType::NoMarker)
        blockFormat.clearProperty(QTextFormat::BlockMarker);
    else
        blockFormat.setMarker(m_markerType);
    if (!m_listStack.isEmpty())
        blockFormat.setIndent(m_listStack.size());
    if (m_cursor.document()->isEmpty()) {
        m_cursor.setBlockFormat(blockFormat);
        m_cursor.setCharFormat(charFormat);
    } else if (m_listItem) {
        m_cursor.insertBlock(blockFormat, QTextCharFormat());
        m_cursor.setCharFormat(charFormat);
    } else {
        m_cursor.insertBlock(blockFormat, charFormat);
    }
    if (m_needsInsertList) {
        m_listStack.push(m_cursor.createList(m_listFormat));
    } else if (!m_listStack.isEmpty() && m_listItem && m_listStack.top()) {
        m_listStack.top()->add(m_cursor.block());
    }
    m_needsInsertList = false;
    m_needsInsertBlock = false;
}